

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Statement> __thiscall Parser::throwStatement(Parser *this)

{
  undefined8 uVar1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar3;
  undefined1 local_38 [16];
  ptr<Expression> toThrow;
  
  consume(in_RSI);
  toThrow.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  toThrow.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar2 = match(in_RSI,StatEnd);
  if (!bVar2) {
    expression((Parser *)local_38);
    std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&toThrow.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *)local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  }
  consume(in_RSI,StatEnd,"\';\'");
  std::make_shared<ThrowStatement,std::shared_ptr<Expression>&>((shared_ptr<Expression> *)local_38);
  uVar1 = local_38._8_8_;
  local_38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filepath)._M_dataplus._M_p = (pointer)local_38._0_8_;
  (this->filepath)._M_string_length = uVar1;
  local_38._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&toThrow.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::throwStatement() {
    consume();
    ptr<Expression> toThrow;

    if(!match(TokenType::StatEnd)) {
        toThrow = expression();
    }
    consume(TokenType::StatEnd, "';'");
    return make<ThrowStatement>(toThrow);
}